

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cc
# Opt level: O3

bool rcg::isFormatSupported(uint64_t pixelformat,bool only_color)

{
  if ((long)pixelformat < 0x20c005a) {
    if (pixelformat - 0x1080008 < 4) {
      return true;
    }
  }
  else if ((long)pixelformat < 0x210003b) {
    if (pixelformat == 0x20c005a) {
      return true;
    }
    if (pixelformat == 0x2100032) {
      return true;
    }
  }
  else {
    if (pixelformat == 0x210003b) {
      return true;
    }
    if (pixelformat == 0x2180014) {
      return true;
    }
  }
  if ((!only_color) &&
     (((pixelformat == 0x1080001 || (pixelformat == 0x10800c6)) || (pixelformat == 0x81080001)))) {
    return true;
  }
  return false;
}

Assistant:

bool isFormatSupported(uint64_t pixelformat, bool only_color)
{
  if (pixelformat == YCbCr411_8 || pixelformat == YCbCr422_8 || pixelformat == YUV422_8 ||
    pixelformat == RGB8 || pixelformat == BayerRG8 || pixelformat == BayerBG8 ||
    pixelformat == BayerGR8 || pixelformat == BayerGB8)
  {
    return true;
  }

  if (!only_color && (pixelformat == Mono8 || pixelformat == Confidence8 ||
    pixelformat == Error8))
  {
    return true;
  }

  return false;
}